

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O3

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessGSOutStreamOperations
          (ConversionStream *this,iterator *Token,String *OutStreamName,char *EntryPoint)

{
  TokenListType *pTVar1;
  _List_node_base *__n;
  int iVar2;
  _List_node_base *p_Var3;
  String *pSVar4;
  int iVar5;
  string msg;
  string local_80;
  ConversionStream *local_60;
  String local_58;
  String *local_38;
  
  p_Var3 = Token->_M_node;
  local_60 = this;
  local_38 = OutStreamName;
  if (*(int *)&p_Var3[1]._M_next != 0x133) {
    FormatString<char[26],char[36]>
              (&local_80,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Token->Type == TokenType::OpenBrace",(char (*) [36])OutStreamName);
    DebugAssertionFailed
              (local_80._M_dataplus._M_p,"ProcessGSOutStreamOperations",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xff6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    p_Var3 = Token->_M_node;
  }
  pTVar1 = &local_60->m_Tokens;
  p_Var3 = p_Var3->_M_next;
  Token->_M_node = p_Var3;
  if (p_Var3 != (_List_node_base *)pTVar1) {
    iVar5 = 1;
    pSVar4 = local_38;
    do {
      iVar2 = *(int *)&p_Var3[1]._M_next;
      if (iVar2 == 0x13b) {
        __n = p_Var3[2]._M_next;
        if ((__n == (_List_node_base *)pSVar4->_M_string_length) &&
           ((__n == (_List_node_base *)0x0 ||
            (iVar2 = bcmp(p_Var3[1]._M_prev,(pSVar4->_M_dataplus)._M_p,(size_t)__n),
            pSVar4 = local_38, iVar2 == 0)))) {
          p_Var3 = p_Var3->_M_next;
          Token->_M_node = p_Var3;
          if (p_Var3 == (_List_node_base *)pTVar1) {
            FormatString<char[15]>(&local_80,(char (*) [15])"Unexpected EOF");
            PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                      (&local_58,local_60,Token,4);
            LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                      (false,"ProcessGSOutStreamOperations",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0x100c,&local_80,(char (*) [2])0x6d28c5,&local_58);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
            p_Var3 = Token->_M_node;
          }
          iVar2 = std::__cxx11::string::compare((char *)&p_Var3[1]._M_prev);
          if (iVar2 != 0) {
            FormatString<char[13]>(&local_80,(char (*) [13])"\'.\' expected");
            PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                      (&local_58,local_60,Token,4);
            LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                      (false,"ProcessGSOutStreamOperations",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0x100d,&local_80,(char (*) [2])0x6d28c5,&local_58);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
          }
          std::__cxx11::string::_M_replace
                    ((ulong)&Token->_M_node[1]._M_prev,0,(char *)Token->_M_node[2]._M_next,0x6faf1e)
          ;
          p_Var3 = Token->_M_node;
          p_Var3[4]._M_next = (_List_node_base *)0x0;
          *(undefined1 *)&(p_Var3[3]._M_prev)->_M_next = 0;
          p_Var3 = Token->_M_node->_M_next;
          Token->_M_node = p_Var3;
          if (p_Var3 == (_List_node_base *)pTVar1) {
            FormatString<char[15]>(&local_80,(char (*) [15])"Unexpected EOF");
            PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                      (&local_58,local_60,Token,4);
            LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                      (false,"ProcessGSOutStreamOperations",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0x1015,&local_80,(char (*) [2])0x6d28c5,&local_58);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
            p_Var3 = Token->_M_node;
          }
          p_Var3[4]._M_next = (_List_node_base *)0x0;
          *(undefined1 *)&(p_Var3[3]._M_prev)->_M_next = 0;
          p_Var3 = Token->_M_node;
          pSVar4 = local_38;
        }
      }
      else if (iVar2 == 0x134) {
        iVar5 = iVar5 + -1;
        if (iVar5 == 0) {
          return;
        }
      }
      else if (iVar2 == 0x133) {
        iVar5 = iVar5 + 1;
      }
      p_Var3 = p_Var3->_M_next;
      Token->_M_node = p_Var3;
    } while (p_Var3 != (_List_node_base *)pTVar1);
  }
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessGSOutStreamOperations(TokenListType::iterator& Token, const String& OutStreamName, const char* EntryPoint)
{
    VERIFY_EXPR(Token->Type == TokenType::OpenBrace);

    ++Token; // Skip open brace
    int BraceCount = 1;
    // Find matching closing brace
    while (Token != m_Tokens.end())
    {
        if (Token->Type == TokenType::OpenBrace)
            ++BraceCount;
        else if (Token->Type == TokenType::ClosingBrace)
        {
            --BraceCount;
            if (BraceCount == 0)
                break;
        }
        if (Token->Type == TokenType::Identifier && Token->Literal == OutStreamName)
        {
            // triStream.Append( Out );
            // ^
            ++Token;
            // triStream.Append( Out );
            //          ^
            VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF");
            VERIFY_PARSER_STATE(Token, Token->Literal == ".", "\'.\' expected");
            Token->Literal = "_";
            Token->Delimiter.clear();
            // triStream_Append( Out );
            //          ^
            ++Token;
            // triStream_Append( Out );
            //           ^
            VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF");
            Token->Delimiter.clear();
            ++Token;
        }
        else
            ++Token;
    }
}